

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O1

void FACT_INTERNAL_GetNextWave
               (FACTCue *cue,FACTSound *sound,FACTTrack *track,FACTTrackInstance *trackInst,
               FACTEvent *evt,FACTEventInstance *evtInst)

{
  ushort uVar1;
  short sVar2;
  short sVar3;
  char *pcVar4;
  FACTWave *pFVar5;
  FACTAudioEngine *pFVar6;
  uint8_t nLoopCount;
  uint16_t uVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  ulong uVar11;
  uint16_t *puVar12;
  ulong uVar13;
  FACTWaveBank *pWaveBank;
  LinkedList *pLVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  FAudioVoiceSends reverbSends;
  FAudioSendDescriptor reverbDesc [2];
  FAudioVoiceSends local_54;
  FAudioSendDescriptor local_48;
  undefined4 local_3c;
  FAudioSubmixVoice *local_38;
  
  if ((evt->field_3).wave.isComplex == '\0') {
    puVar12 = (uint16_t *)((long)&evt->field_3 + 8);
    pbVar10 = (byte *)((long)&evt->field_3 + 10);
    bVar15 = true;
  }
  else {
    if (((trackInst->activeWave).wave != (FACTWave *)0x0) &&
       (uVar1 = *(ushort *)((long)&evt->field_3 + 8), (uVar1 & 0xf0) != 0)) {
      uVar8 = uVar1 & 0xf;
      if (uVar8 < 2) {
        fVar17 = (float)((evtInst->field_3).valuei + 1);
        (evtInst->field_3).valuei = (uint32_t)fVar17;
        fVar19 = 0.0;
        if ((uint)fVar17 < (uint)*(ushort *)((long)&evt->field_3 + 10)) {
          fVar19 = fVar17;
        }
        (evtInst->field_3).value = fVar19;
      }
      else if (uVar8 - 3 < 2) {
        uVar11 = (ulong)*(ushort *)((long)&evt->field_3 + 10);
        if (uVar11 == 0) {
          fVar19 = 0.0;
        }
        else {
          fVar19 = 0.0;
          uVar13 = 0;
          do {
            if ((evtInst->field_3).valuei != uVar13) {
              fVar19 = fVar19 + (float)*(byte *)(*(long *)((long)&evt->field_3 + 0x20) + uVar13);
            }
            uVar13 = uVar13 + 1;
          } while (uVar11 != uVar13);
        }
        uVar8 = stb_rand();
        uVar11 = (ulong)*(ushort *)((long)&evt->field_3 + 10);
        if (uVar11 != 0) {
          fVar17 = (float)((double)uVar8 * 2.3283064365386963e-10) * fVar19;
          do {
            uVar11 = uVar11 - 1;
            if (((evtInst->field_3).valuei != uVar11) &&
               (fVar19 = fVar19 - (float)*(byte *)(*(long *)((long)&evt->field_3 + 0x20) + uVar11),
               fVar19 < fVar17)) {
              (evtInst->field_3).valuei = (uint32_t)uVar11;
              break;
            }
          } while (uVar11 != 0);
        }
      }
      else if (uVar8 == 2) {
        uVar11 = (ulong)*(ushort *)((long)&evt->field_3 + 10);
        if (uVar11 == 0) {
          fVar19 = 0.0;
        }
        else {
          fVar19 = 0.0;
          uVar13 = 0;
          do {
            fVar19 = fVar19 + (float)*(byte *)(*(long *)((long)&evt->field_3 + 0x20) + uVar13);
            uVar13 = uVar13 + 1;
          } while (uVar11 != uVar13);
        }
        uVar8 = stb_rand();
        fVar17 = (float)((double)uVar8 * 2.3283064365386963e-10) * fVar19;
        uVar11 = (ulong)*(ushort *)((long)&evt->field_3 + 10);
        do {
          uVar13 = uVar11 - 1;
          if (uVar11 == 0) goto LAB_0010d8fe;
          fVar19 = fVar19 - (float)*(byte *)(*(long *)((long)&evt->field_3 + 0x20) + -1 + uVar11);
          uVar11 = uVar13;
        } while (fVar17 <= fVar19);
        (evtInst->field_3).valuei = (uint32_t)uVar13;
      }
    }
LAB_0010d8fe:
    bVar15 = (undefined1  [72])((undefined1  [72])evt->field_3 & (undefined1  [72])0xf0) ==
             (undefined1  [72])0x0;
    pbVar10 = (byte *)(*(long *)((long)&evt->field_3 + 0x18) + (ulong)(evtInst->field_3).valuei);
    puVar12 = (uint16_t *)
              ((ulong)(evtInst->field_3).valuei * 2 + *(long *)((long)&evt->field_3 + 0x10));
  }
  uVar7 = *puVar12;
  pLVar14 = cue->parentBank->parentEngine->wbList;
  if (pLVar14 == (LinkedList *)0x0) {
    pWaveBank = (FACTWaveBank *)0x0;
  }
  else {
    pcVar4 = cue->parentBank->wavebankNames[*pbVar10];
    do {
      pWaveBank = (FACTWaveBank *)pLVar14->entry;
      iVar9 = SDL_strcmp(pcVar4,pWaveBank->name);
      if (iVar9 == 0) break;
      pLVar14 = pLVar14->next;
    } while (pLVar14 != (LinkedList *)0x0);
  }
  bVar16 = false;
  nLoopCount = '\0';
  if (!(bool)(bVar15 ^ 1U | evtInst->loopCount != 0xff)) {
    bVar16 = (*(byte *)((long)&evt->field_3 + 0x45) & 0xf) == 0;
    nLoopCount = -bVar16;
  }
  FACTWaveBank_Prepare
            (pWaveBank,uVar7,(uint)(evt->field_3).wave.flags,0,nLoopCount,
             &(trackInst->upcomingWave).wave);
  pFVar5 = (trackInst->upcomingWave).wave;
  pFVar5->parentCue = cue;
  if (sound->dspCodeCount != '\0') {
    local_54.pSends = &local_48;
    local_48.Flags = 0;
    pFVar6 = cue->parentBank->parentEngine;
    local_48.pOutputVoice = pFVar6->master;
    local_3c = 0;
    local_38 = pFVar6->reverbVoice;
    local_54.SendCount = 2;
    FAudioVoice_SetOutputVoices(pFVar5->voice,&local_54);
  }
  if (cue->active3D != '\0') {
    FACTWave_SetMatrixCoefficients
              ((trackInst->upcomingWave).wave,cue->srcChannels,cue->dstChannels,
               cue->matrixCoefficients);
  }
  if ((*(byte *)((long)&evt->field_3 + 0x45) & 0x10) == 0) {
    (trackInst->upcomingWave).basePitch = sound->pitch;
  }
  else {
    uVar8 = stb_rand();
    sVar2 = (evt->field_3).wave.minPitch;
    if ((trackInst->activeWave).wave == (FACTWave *)0x0) {
LAB_0010da94:
      sVar3 = sound->pitch;
    }
    else {
      uVar1 = (evt->field_3).wave.variationFlags;
      if ((uVar1 >> 8 & 1) == 0) goto LAB_0010daab;
      if ((uVar1 & 4) == 0) goto LAB_0010da94;
      sVar3 = (trackInst->activeWave).basePitch;
    }
    (trackInst->upcomingWave).basePitch =
         (short)(int)((float)((int)(evt->field_3).wave.maxPitch - (int)sVar2) *
                     (float)((double)uVar8 * 2.3283064365386963e-10)) + sVar2 + sVar3;
  }
LAB_0010daab:
  if ((*(byte *)((long)&evt->field_3 + 0x45) & 0x20) == 0) {
    fVar19 = sound->volume;
LAB_0010db2f:
    fVar19 = fVar19 + track->volume;
  }
  else {
    uVar8 = stb_rand();
    fVar19 = (evt->field_3).wave.minVolume;
    fVar19 = ((evt->field_3).wave.maxVolume - fVar19) *
             (float)((double)uVar8 * 2.3283064365386963e-10) + fVar19;
    if ((trackInst->activeWave).wave == (FACTWave *)0x0) {
      fVar19 = fVar19 + sound->volume;
      goto LAB_0010db2f;
    }
    uVar1 = (evt->field_3).wave.variationFlags;
    if ((uVar1 >> 9 & 1) == 0) goto LAB_0010db3b;
    if ((uVar1 & 1) == 0) {
      fVar19 = fVar19 + sound->volume;
      goto LAB_0010db2f;
    }
    fVar19 = fVar19 + (trackInst->activeWave).baseVolume;
  }
  (trackInst->upcomingWave).baseVolume = fVar19;
LAB_0010db3b:
  if ((evt->field_3).wave.variationFlags < 0x4000) {
    (trackInst->upcomingWave).baseQFactor = 1.0 / ((float)track->qfactor / 3.0);
    fVar19 = (float)track->frequency /
             (float)(cue->parentBank->parentEngine->audio->master->field_19).master.inputSampleRate;
    if (0.5 <= fVar19) {
      fVar19 = 0.5;
    }
    dVar18 = (double)SDL_sin((double)(fVar19 * 3.1415927));
    fVar19 = (trackInst->upcomingWave).baseQFactor;
    auVar20._4_8_ = 0;
    auVar20._0_4_ = fVar19;
    auVar20._12_4_ = (int)((ulong)(dVar18 + dVar18) >> 0x20);
    auVar21._8_8_ = auVar20._8_8_;
    auVar21._4_4_ = (float)(dVar18 + dVar18);
    auVar21._0_4_ = fVar19;
    auVar21 = minps(auVar21,_DAT_00126430);
    (trackInst->upcomingWave).baseQFactor = (float)(int)auVar21._0_8_;
    (trackInst->upcomingWave).baseFrequency = (float)(int)((ulong)auVar21._0_8_ >> 0x20);
  }
  else {
    uVar8 = stb_rand();
    fVar19 = (evt->field_3).wave.minQFactor;
    fVar17 = 1.0 / (((evt->field_3).wave.maxQFactor - fVar19) *
                    (float)((double)uVar8 * 2.3283064365386963e-10) + fVar19);
    uVar8 = stb_rand();
    fVar19 = (evt->field_3).wave.minFrequency;
    fVar19 = (((evt->field_3).wave.maxFrequency - fVar19) *
              (float)((double)uVar8 * 2.3283064365386963e-10) + fVar19) /
             (float)(cue->parentBank->parentEngine->audio->master->field_19).master.inputSampleRate;
    if (0.5 <= fVar19) {
      fVar19 = 0.5;
    }
    dVar18 = (double)SDL_sin((double)(fVar19 * 3.1415927));
    fVar19 = (float)(dVar18 + dVar18);
    if (1.0 <= fVar19) {
      fVar19 = 1.0;
    }
    if ((trackInst->activeWave).wave == (FACTWave *)0x0) {
      (trackInst->upcomingWave).baseQFactor = fVar17;
      (trackInst->upcomingWave).baseFrequency = fVar19;
    }
    else if ((*(byte *)((long)&evt->field_3 + 0x45) & 0xc) != 0) {
      (trackInst->upcomingWave).baseQFactor = fVar17;
      (trackInst->upcomingWave).baseFrequency = fVar19;
    }
  }
  if (bVar16) {
    uVar7 = 0;
  }
  else {
    if (evtInst->loopCount == 0) {
      return;
    }
    uVar7 = evtInst->loopCount - 1;
  }
  evtInst->loopCount = uVar7;
  return;
}

Assistant:

void FACT_INTERNAL_GetNextWave(
	FACTCue *cue,
	FACTSound *sound,
	FACTTrack *track,
	FACTTrackInstance *trackInst,
	FACTEvent *evt,
	FACTEventInstance *evtInst
) {
	FAudioSendDescriptor reverbDesc[2];
	FAudioVoiceSends reverbSends;
	const char *wbName;
	FACTWaveBank *wb = NULL;
	LinkedList *list;
	uint16_t wbTrack;
	uint8_t wbIndex;
	uint8_t loopCount = 0;
	float max, next;
	uint8_t noTrackVariation = 1;
	uint32_t i;

	/* Track Variation */
	if (evt->wave.isComplex)
	{
		if (	trackInst->activeWave.wave == NULL ||
			!(evt->wave.complex.variation & 0x00F0)	)
		{
			/* No-op, no variation on loop */
		}
		/* Ordered, Ordered From Random */
		else if (	(evt->wave.complex.variation & 0xF) == 0 ||
				(evt->wave.complex.variation & 0xF) == 1	)
		{
			evtInst->valuei += 1;
			if (evtInst->valuei >= evt->wave.complex.trackCount)
			{
				evtInst->valuei = 0;
			}
		}
		/* Random */
		else if ((evt->wave.complex.variation & 0xF) == 2)
		{
			max = 0.0f;
			for (i = 0; i < evt->wave.complex.trackCount; i += 1)
			{
				max += evt->wave.complex.weights[i];
			}
			next = FACT_INTERNAL_rng() * max;
			for (i = evt->wave.complex.trackCount; i > 0; i -= 1)
			{
				if (next > (max - evt->wave.complex.weights[i - 1]))
				{
					evtInst->valuei = i - 1;
					break;
				}
				max -= evt->wave.complex.weights[i - 1];
			}
		}
		/* Random (No Immediate Repeats), Shuffle */
		else if (	(evt->wave.complex.variation & 0xF) == 3 ||
				(evt->wave.complex.variation & 0xF) == 4	)
		{
			max = 0.0f;
			for (i = 0; i < evt->wave.complex.trackCount; i += 1)
			{
				if (i == evtInst->valuei)
				{
					continue;
				}
				max += evt->wave.complex.weights[i];
			}
			next = FACT_INTERNAL_rng() * max;
			for (i = evt->wave.complex.trackCount; i > 0; i -= 1)
			{
				if (i - 1 == evtInst->valuei)
				{
					continue;
				}
				if (next > (max - evt->wave.complex.weights[i - 1]))
				{
					evtInst->valuei = i - 1;
					break;
				}
				max -= evt->wave.complex.weights[i - 1];
			}
		}

		if (evt->wave.complex.variation & 0x00F0)
		{
			noTrackVariation = 0;
		}

		wbIndex = evt->wave.complex.wavebanks[evtInst->valuei];
		wbTrack = evt->wave.complex.tracks[evtInst->valuei];
	}
	else
	{
		wbIndex = evt->wave.simple.wavebank;
		wbTrack = evt->wave.simple.track;
	}
	wbName = cue->parentBank->wavebankNames[wbIndex];
	list = cue->parentBank->parentEngine->wbList;
	while (list != NULL)
	{
		wb = (FACTWaveBank*) list->entry;
		if (FAudio_strcmp(wbName, wb->name) == 0)
		{
			break;
		}
		list = list->next;
	}
	FAudio_assert(wb != NULL);

	/* Generate the Wave */
	if (	evtInst->loopCount == 255 &&
		noTrackVariation &&
		!(evt->wave.variationFlags & 0x0F00)	)
	{
		/* For infinite loops with no variation, let Wave do the work */
		loopCount = 255;
	}
	FACTWaveBank_Prepare(
		wb,
		wbTrack,
		evt->wave.flags,
		0,
		loopCount,
		&trackInst->upcomingWave.wave
	);
	trackInst->upcomingWave.wave->parentCue = cue;
	if (sound->dspCodeCount > 0) /* Never more than 1...? */
	{
		reverbDesc[0].Flags = 0;
		reverbDesc[0].pOutputVoice = cue->parentBank->parentEngine->master;
		reverbDesc[1].Flags = 0;
		reverbDesc[1].pOutputVoice = cue->parentBank->parentEngine->reverbVoice;
		reverbSends.SendCount = 2;
		reverbSends.pSends = reverbDesc;
		FAudioVoice_SetOutputVoices(
			trackInst->upcomingWave.wave->voice,
			&reverbSends
		);
	}

	/* 3D Audio */
	if (cue->active3D)
	{
		FACTWave_SetMatrixCoefficients(
			trackInst->upcomingWave.wave,
			cue->srcChannels,
			cue->dstChannels,
			cue->matrixCoefficients
		);
	}
	else
	{
		/* TODO: Position/Angle/UseCenterSpeaker */
	}

	/* Pitch Variation */
	if (evt->wave.variationFlags & 0x1000)
	{
		const int16_t rngPitch = (int16_t) (
			FACT_INTERNAL_rng() *
			(evt->wave.maxPitch - evt->wave.minPitch)
		) + evt->wave.minPitch;
		if (trackInst->activeWave.wave != NULL)
		{
			/* Variation on Loop */
			if (evt->wave.variationFlags & 0x0100)
			{
				/* Add/Replace */
				if (evt->wave.variationFlags & 0x0004)
				{
					trackInst->upcomingWave.basePitch =
						trackInst->activeWave.basePitch + rngPitch;
				}
				else
				{
					trackInst->upcomingWave.basePitch = rngPitch + sound->pitch;
				}
			}
		}
		else
		{
			/* Initial Pitch Variation */
			trackInst->upcomingWave.basePitch = rngPitch + sound->pitch;
		}
	}
	else
	{
		trackInst->upcomingWave.basePitch = sound->pitch;
	}

	/* Volume Variation */
	if (evt->wave.variationFlags & 0x2000)
	{
		const float rngVolume = (
			FACT_INTERNAL_rng() *
			(evt->wave.maxVolume - evt->wave.minVolume)
		) + evt->wave.minVolume;
		if (trackInst->activeWave.wave != NULL)
		{
			/* Variation on Loop */
			if (evt->wave.variationFlags & 0x0200)
			{
				/* Add/Replace */
				if (evt->wave.variationFlags & 0x0001)
				{
					trackInst->upcomingWave.baseVolume =
						trackInst->activeWave.baseVolume + rngVolume;
				}
				else
				{
					trackInst->upcomingWave.baseVolume = (
						rngVolume +
						sound->volume +
						track->volume
					);
				}
			}
		}
		else
		{
			/* Initial Volume Variation */
			trackInst->upcomingWave.baseVolume = (
				rngVolume +
				sound->volume +
				track->volume
			);
		}
	}
	else
	{
		trackInst->upcomingWave.baseVolume = sound->volume + track->volume;
	}

	/* Filter Variation, QFactor/Freq are always together */
	if (evt->wave.variationFlags & 0xC000)
	{
		const float rngQFactor = 1.0f / (
			FACT_INTERNAL_rng() *
			(evt->wave.maxQFactor - evt->wave.minQFactor) +
			evt->wave.minQFactor
		);
		const float rngFrequency = FACT_INTERNAL_CalculateFilterFrequency(
			(
				FACT_INTERNAL_rng() *
				(evt->wave.maxFrequency - evt->wave.minFrequency) +
				evt->wave.minFrequency
			),
			cue->parentBank->parentEngine->audio->master->master.inputSampleRate
		);
		if (trackInst->activeWave.wave != NULL)
		{
			/* Variation on Loop */
			if (evt->wave.variationFlags & 0x0C00)
			{
				/* TODO: Add/Replace */
				/* FIXME: Which is QFactor/Freq?
				if (evt->wave.variationFlags & 0x0010)
				{
				}
				else
				{
				}
				if (evt->wave.variationFlags & 0x0040)
				{
				}
				else
				{
				}
				*/
				trackInst->upcomingWave.baseQFactor = rngQFactor;
				trackInst->upcomingWave.baseFrequency = rngFrequency;
			}
		}
		else
		{
			/* Initial Filter Variation */
			trackInst->upcomingWave.baseQFactor = rngQFactor;
			trackInst->upcomingWave.baseFrequency = rngFrequency;
		}
	}
	else
	{
		trackInst->upcomingWave.baseQFactor = 1.0f / (track->qfactor / 3.0f);
		trackInst->upcomingWave.baseFrequency = FACT_INTERNAL_CalculateFilterFrequency(
			track->frequency,
			cue->parentBank->parentEngine->audio->master->master.inputSampleRate
		);

		/* FIXME: For some reason the 0.67 Q Factor causes problems, but it's also
		 * the only possible value until ~1 so just clamp it for now.
		 */
		trackInst->upcomingWave.baseQFactor = FAudio_min(
			trackInst->upcomingWave.baseQFactor,
			1.0f
		);
	}

	/* Try to change loop counter at the very end */
	if (loopCount == 255)
	{
		/* For infinite loops with no variation, Wave does the work */
		evtInst->loopCount = 0;
	}
	else if (evtInst->loopCount > 0)
	{
		evtInst->loopCount -= 1;
	}
}